

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_logger_record_failure(fctchk_t *chk,fct_nlist_t *fail_list)

{
  char *buffer;
  fct_nlist_t *buffer_len;
  
  buffer_len = fail_list;
  buffer = (char *)malloc(0x100);
  if (buffer != (char *)0x0) {
    fct_snprintf(buffer,(size_t)buffer_len,"%s(%d):\n    %s",chk->file,(ulong)(uint)chk->lineno,
                 chk->msg);
    fct_nlist__append(fail_list,buffer);
    return;
  }
  __assert_fail("str != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0xa87,
                "void fct_logger_record_failure(const fctchk_t *, fct_nlist_t *)");
}

Assistant:

static void
fct_logger_record_failure(fctchk_t const* chk, fct_nlist_t* fail_list)
{
    /* For now we will truncate the string to some set amount, later
    we can work out a dynamic string object. */
    char *str = (char*)malloc(sizeof(char)*FCT_MAX_LOG_LINE);
    FCT_ASSERT( str != NULL );
    fct_snprintf(
        str,
        FCT_MAX_LOG_LINE,
        "%s(%d):\n    %s",
        fctchk__file(chk),
        fctchk__lineno(chk),
        fctchk__msg(chk)
    );
    /* Append it to the listing ... */
    fct_nlist__append(fail_list, (void*)str);
}